

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int uv__accept(int sockfd)

{
  int *piVar1;
  bool bVar2;
  int local_18;
  int err;
  int peerfd;
  int sockfd_local;
  
  if (sockfd < 0) {
    __assert_fail("sockfd >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/core.c"
                  ,0x1d4,"int uv__accept(int)");
  }
  do {
    peerfd = accept(sockfd,(sockaddr *)0x0,(socklen_t *)0x0);
    bVar2 = false;
    if (peerfd == -1) {
      piVar1 = __errno_location();
      bVar2 = *piVar1 == 4;
    }
  } while (bVar2);
  if (peerfd == -1) {
    piVar1 = __errno_location();
    peerfd = -*piVar1;
  }
  else {
    local_18 = uv__cloexec_ioctl(peerfd,1);
    if (local_18 == 0) {
      local_18 = uv__nonblock_ioctl(peerfd,1);
    }
    if (local_18 != 0) {
      uv__close(peerfd);
      peerfd = local_18;
    }
  }
  return peerfd;
}

Assistant:

int uv__accept(int sockfd) {
  int peerfd;
  int err;

  (void) &err;
  assert(sockfd >= 0);

  do
#ifdef uv__accept4
    peerfd = uv__accept4(sockfd, NULL, NULL, SOCK_NONBLOCK|SOCK_CLOEXEC);
#else
    peerfd = accept(sockfd, NULL, NULL);
#endif
  while (peerfd == -1 && errno == EINTR);

  if (peerfd == -1)
    return UV__ERR(errno);

#ifndef uv__accept4
  err = uv__cloexec(peerfd, 1);
  if (err == 0)
    err = uv__nonblock(peerfd, 1);

  if (err != 0) {
    uv__close(peerfd);
    return err;
  }
#endif

  return peerfd;
}